

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O1

lu_byte luaH_getstr(Table *t,TString *key,TValue *res)

{
  int *piVar1;
  TValue *io2;
  TValue *pTVar2;
  TValue *io1;
  TValue *io;
  Value local_18;
  byte local_10;
  
  if (key->shrlen < '\0') {
    local_10 = key->tt | 0x40;
    local_18 = (Value)key;
    pTVar2 = getgeneric(t,(TValue *)&local_18,0);
  }
  else {
    pTVar2 = (TValue *)(t->node + (~(-1 << (t->lsizenode & 0x1f)) & key->hash));
    do {
      if ((((NodeKey *)pTVar2)->key_tt == 'D') &&
         ((TString *)(((NodeKey *)pTVar2)->key_val).gc == key)) goto LAB_0011afc4;
      piVar1 = &((NodeKey *)pTVar2)->next;
      pTVar2 = (TValue *)((long)pTVar2 + (long)*piVar1 * 0x18);
    } while ((long)*piVar1 != 0);
    pTVar2 = &absentkey;
  }
LAB_0011afc4:
  if ((((NodeKey *)pTVar2)->tt_ & 0xf) != 0) {
    res->value_ = ((NodeKey *)pTVar2)->value_;
    res->tt_ = ((NodeKey *)pTVar2)->tt_;
  }
  return ((NodeKey *)pTVar2)->tt_ & 0x3f;
}

Assistant:

lu_byte luaH_getstr (Table *t, TString *key, TValue *res) {
  return finishnodeget(Hgetstr(t, key), res);
}